

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.hpp
# Opt level: O0

IMemoryAllocator * __thiscall
Diligent::SRBMemoryAllocator::GetShaderVariableDataAllocator(SRBMemoryAllocator *this,Uint32 Ind)

{
  Char *Message;
  FixedBlockMemoryAllocator *local_60;
  undefined1 local_38 [8];
  string msg;
  Uint32 Ind_local;
  SRBMemoryAllocator *this_local;
  
  msg.field_2._12_4_ = Ind;
  if ((this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) &&
     (this->m_ShaderVariableDataAllocatorCount <= Ind)) {
    FormatString<char[26],char[72]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_DataAllocators == nullptr || Ind < m_ShaderVariableDataAllocatorCount",
               (char (*) [72])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderVariableDataAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/SRBMemoryAllocator.hpp"
               ,0x36);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_DataAllocators == (FixedBlockMemoryAllocator *)0x0) {
    local_60 = (FixedBlockMemoryAllocator *)this->m_RawMemAllocator;
  }
  else {
    local_60 = this->m_DataAllocators + (uint)msg.field_2._12_4_;
  }
  return &local_60->super_IMemoryAllocator;
}

Assistant:

IMemoryAllocator& GetShaderVariableDataAllocator(Uint32 Ind)
    {
        VERIFY_EXPR(m_DataAllocators == nullptr || Ind < m_ShaderVariableDataAllocatorCount);
        return m_DataAllocators != nullptr ? m_DataAllocators[Ind] : m_RawMemAllocator;
    }